

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_primitives_conversion.cpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
skiwi::(anonymous_namespace)::make_let_names_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,int nr_args)

{
  ostream *poVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extraout_RAX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extraout_RAX_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar2;
  long lVar3;
  long *plVar4;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL> temp;
  undefined1 local_258 [32];
  pointer local_238;
  long lStack_230;
  undefined1 local_228 [16];
  undefined1 *local_218;
  undefined1 local_208 [16];
  undefined1 *local_1f8 [2];
  undefined1 local_1e8 [16];
  long *local_1d8 [2];
  long local_1c8 [2];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_238 = (pointer)local_228;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"x","");
  local_218 = local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"y","");
  local_1f8[0] = local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"z","");
  plVar4 = local_1c8;
  local_1d8[0] = plVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"w","");
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar2 = __return_storage_ptr__;
  if (0 < (int)this) {
    lVar3 = 0;
    do {
      g_alpha_conversion_index = g_alpha_conversion_index + 1;
      std::__cxx11::stringstream::stringstream(local_1b8);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,*(char **)((long)&local_238 + lVar3),
                          *(long *)(local_228 + lVar3 + -8));
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"_",1);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base(local_138);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_258);
      pvVar2 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(local_258 + 0x10);
      if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_258._0_8_ != pvVar2) {
        operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
        pvVar2 = extraout_RAX;
      }
      lVar3 = lVar3 + 0x20;
    } while (((ulong)this & 0xffffffff) << 5 != lVar3);
  }
  lVar3 = -0x80;
  do {
    if (plVar4 != (long *)plVar4[-2]) {
      operator_delete((long *)plVar4[-2],*plVar4 + 1);
      pvVar2 = extraout_RAX_00;
    }
    plVar4 = plVar4 + -4;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0);
  return pvVar2;
}

Assistant:

std::vector<std::string> make_let_names(int nr_args)
    {
    assert(nr_args <= 4);
    std::array<std::string, 4> temp = { {"x", "y", "z", "w"} };
    std::vector<std::string> let_names;
    for (int i = 0; i < nr_args; ++i)
      {
      let_names.push_back(make_name(temp[i], g_alpha_conversion_index++));
      }
    return let_names;
    }